

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

bool __thiscall cmComputeTargetDepends::Compute(cmComputeTargetDepends *this)

{
  bool bVar1;
  cmComputeComponentGraph ccg2;
  cmComputeComponentGraph ccg1;
  string local_1f8;
  undefined1 local_1d8 [224];
  undefined1 local_f8 [224];
  
  CollectTargets(this);
  CollectDepends(this);
  if (this->DebugMode == true) {
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"initial","");
    DisplayGraph(this,&this->InitialGraph,(string *)local_f8);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
  }
  cmComputeComponentGraph::cmComputeComponentGraph
            ((cmComputeComponentGraph *)local_f8,&this->InitialGraph);
  cmComputeComponentGraph::Compute((cmComputeComponentGraph *)local_f8);
  bVar1 = CheckComponents(this,(cmComputeComponentGraph *)local_f8);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_004f2bbd;
  }
  CollectSideEffects(this);
  ComputeIntermediateGraph(this);
  if (this->DebugMode == true) {
    DisplaySideEffects(this);
    local_1d8._0_8_ = local_1d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"intermediate","");
    DisplayGraph(this,&this->IntermediateGraph,(string *)local_1d8);
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
  }
  cmComputeComponentGraph::cmComputeComponentGraph
            ((cmComputeComponentGraph *)local_1d8,&this->IntermediateGraph);
  cmComputeComponentGraph::Compute((cmComputeComponentGraph *)local_1d8);
  if (this->DebugMode == true) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"intermediate","");
    DisplayComponents(this,(cmComputeComponentGraph *)local_1d8,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = CheckComponents(this,(cmComputeComponentGraph *)local_1d8);
  if (bVar1) {
    bVar1 = ComputeFinalDepends(this,(cmComputeComponentGraph *)local_1d8);
    if (!bVar1) goto LAB_004f2bb1;
    bVar1 = true;
    if (this->DebugMode == true) {
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"final","");
      DisplayGraph(this,&this->FinalGraph,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
LAB_004f2bb1:
    bVar1 = false;
  }
  cmComputeComponentGraph::~cmComputeComponentGraph((cmComputeComponentGraph *)local_1d8);
LAB_004f2bbd:
  cmComputeComponentGraph::~cmComputeComponentGraph((cmComputeComponentGraph *)local_f8);
  return bVar1;
}

Assistant:

bool cmComputeTargetDepends::Compute()
{
  // Build the original graph.
  this->CollectTargets();
  this->CollectDepends();
  if (this->DebugMode) {
    this->DisplayGraph(this->InitialGraph, "initial");
  }
  cmComputeComponentGraph ccg1(this->InitialGraph);
  ccg1.Compute();
  if (!this->CheckComponents(ccg1)) {
    return false;
  }

  // Compute the intermediate graph.
  this->CollectSideEffects();
  this->ComputeIntermediateGraph();
  if (this->DebugMode) {
    this->DisplaySideEffects();
    this->DisplayGraph(this->IntermediateGraph, "intermediate");
  }

  // Identify components.
  cmComputeComponentGraph ccg2(this->IntermediateGraph);
  ccg2.Compute();
  if (this->DebugMode) {
    this->DisplayComponents(ccg2, "intermediate");
  }
  if (!this->CheckComponents(ccg2)) {
    return false;
  }

  // Compute the final dependency graph.
  if (!this->ComputeFinalDepends(ccg2)) {
    return false;
  }
  if (this->DebugMode) {
    this->DisplayGraph(this->FinalGraph, "final");
  }

  return true;
}